

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

string * __thiscall
upb::generator::GetModeInit_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,upb_MiniTableField *field32,
          upb_MiniTableField *field64)

{
  generator gVar1;
  uint *field64_00;
  string local_d0;
  AlphaNum local_b0;
  AlphaNum local_80;
  AlphaNum local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  gVar1 = this[0xb];
  field64_00 = &switchD_0023f5c0::switchdataD_0037015c;
  switch((byte)gVar1 & 3) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    goto switchD_0023f5c0_caseD_3;
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
switchD_0023f5c0_caseD_3:
  if (((byte)gVar1 & 4) != 0) {
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView(" | (int)kUpb_LabelFlags_IsPacked");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0);
  }
  if (((byte)gVar1 & 8) != 0) {
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView(" | (int)kUpb_LabelFlags_IsExtension");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0);
  }
  if (((byte)gVar1 & 0x10) != 0) {
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView(" | (int)kUpb_LabelFlags_IsAlternate");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0);
  }
  local_b0.piece_ = absl::lts_20250127::NullSafeStringView(" | ((int)");
  GetFieldRep_abi_cxx11_(&local_d0,this,field32,(upb_MiniTableField *)field64_00);
  local_50.piece_._M_len = local_d0._M_string_length;
  local_50.piece_._M_str = local_d0._M_dataplus._M_p;
  local_80.piece_ = absl::lts_20250127::NullSafeStringView(" << kUpb_FieldRep_Shift)");
  absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0,&local_50,&local_80);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string GetModeInit(const upb_MiniTableField* field32,
                        const upb_MiniTableField* field64) {
  std::string ret;
  uint8_t mode32 = field32->UPB_PRIVATE(mode);
  switch (mode32 & kUpb_FieldMode_Mask) {
    case kUpb_FieldMode_Map:
      ret = "(int)kUpb_FieldMode_Map";
      break;
    case kUpb_FieldMode_Array:
      ret = "(int)kUpb_FieldMode_Array";
      break;
    case kUpb_FieldMode_Scalar:
      ret = "(int)kUpb_FieldMode_Scalar";
      break;
    default:
      break;
  }

  if (mode32 & kUpb_LabelFlags_IsPacked) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsPacked");
  }

  if (mode32 & kUpb_LabelFlags_IsExtension) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsExtension");
  }

  if (mode32 & kUpb_LabelFlags_IsAlternate) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsAlternate");
  }

  absl::StrAppend(&ret, " | ((int)", GetFieldRep(field32, field64),
                  " << kUpb_FieldRep_Shift)");
  return ret;
}